

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O1

size_t __thiscall
proto2_unittest::TestParsingMergeLite_RepeatedGroup::ByteSizeLong
          (TestParsingMergeLite_RepeatedGroup *this)

{
  ulong uVar1;
  int iVar2;
  size_t sVar3;
  uint uVar4;
  
  if ((undefined1  [16])((undefined1  [16])this->field_0 & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    sVar3 = 0;
  }
  else {
    sVar3 = TestAllTypesLite::ByteSizeLong((this->field_0)._impl_.repeated_group_all_types_);
    uVar4 = (uint)sVar3 | 1;
    iVar2 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar3 = sVar3 + (iVar2 * 9 + 0x49U >> 6) + 2;
  }
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    sVar3 = sVar3 + *(long *)((uVar1 & 0xfffffffffffffffe) + 0x10);
  }
  if (((int)sVar3 != 0) || ((this->field_0)._impl_._cached_size_.atom_ != 0)) {
    (this->field_0)._impl_._cached_size_.atom_ = (int)sVar3;
  }
  return sVar3;
}

Assistant:

::size_t TestParsingMergeLite_RepeatedGroup::ByteSizeLong() const {
  const TestParsingMergeLite_RepeatedGroup& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestParsingMergeLite.RepeatedGroup)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

   {
    // .proto2_unittest.TestAllTypesLite repeated_group_all_types = 21;
    cached_has_bits = this_._impl_._has_bits_[0];
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.repeated_group_all_types_);
    }
  }
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    total_size += this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size();
  }
  this_._impl_._cached_size_.Set(::_pbi::ToCachedSize(total_size));
  return total_size;
}